

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train.c
# Opt level: O2

char * readline(FILE *input)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  
  pcVar1 = fgets(line,max_line_len,(FILE *)input);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    do {
      pcVar1 = line;
      pcVar2 = strrchr(line,10);
      if (pcVar2 != (char *)0x0) {
        return pcVar1;
      }
      lVar5 = (long)max_line_len;
      iVar4 = (int)(lVar5 * 2);
      max_line_len = iVar4;
      pcVar1 = (char *)realloc(pcVar1,lVar5 * 2);
      line = pcVar1;
      sVar3 = strlen(pcVar1);
      pcVar2 = fgets(pcVar1 + (int)sVar3,iVar4 - (int)sVar3,(FILE *)input);
      pcVar1 = line;
    } while (pcVar2 != (char *)0x0);
  }
  return pcVar1;
}

Assistant:

static char* readline(FILE *input)
{
	int len;

	if(fgets(line,max_line_len,input) == NULL)
		return NULL;

	while(strrchr(line,'\n') == NULL)
	{
		max_line_len *= 2;
		line = (char *) realloc(line,max_line_len);
		len = (int) strlen(line);
		if(fgets(line+len,max_line_len-len,input) == NULL)
			break;
	}
	return line;
}